

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers_iforest.hpp
# Opt level: O2

void remap_terminal_trees<PredictionData<float,unsigned_long>,unsigned_long>
               (IsoForest *model_outputs,ExtIsoForest *model_outputs_ext,
               PredictionData<float,_unsigned_long> *prediction_data,unsigned_long *tree_num,
               int nthreads)

{
  pointer pvVar1;
  pointer pvVar2;
  pointer pvVar3;
  pointer pIVar4;
  size_t sVar5;
  pointer pvVar6;
  pointer pvVar7;
  pointer pvVar8;
  pointer pIVar9;
  unsigned_long uVar10;
  pointer puVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  undefined4 in_register_00000084;
  size_t tree;
  long lVar15;
  long *plVar16;
  size_t sVar17;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_38;
  
  if (model_outputs == (IsoForest *)0x0) {
    pvVar6 = (model_outputs_ext->hplanes).
             super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pvVar7 = (model_outputs_ext->hplanes).
             super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_38._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_38._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uVar10 = std::
             accumulate<__gnu_cxx::__normal_iterator<std::vector<IsoHPlane,std::allocator<IsoHPlane>>*,std::vector<std::vector<IsoHPlane,std::allocator<IsoHPlane>>,std::allocator<std::vector<IsoHPlane,std::allocator<IsoHPlane>>>>>,unsigned_long,remap_terminal_trees<PredictionData<float,unsigned_long>,unsigned_long>(IsoForest*,ExtIsoForest*,PredictionData<float,unsigned_long>&,unsigned_long*,int)::_lambda(unsigned_long,std::vector<IsoHPlane,std::allocator<IsoHPlane>>const&)_1_>
                       (pvVar6,pvVar7,0,0x18,CONCAT44(in_register_00000084,nthreads));
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_38,uVar10);
    lVar14 = 0;
    for (lVar15 = 0; puVar11 = local_38._M_impl.super__Vector_impl_data._M_start,
        lVar15 != ((long)pvVar7 - (long)pvVar6) / 0x18; lVar15 = lVar15 + 1) {
      for (; puVar11 != local_38._M_impl.super__Vector_impl_data._M_finish; puVar11 = puVar11 + 1) {
        *puVar11 = 0;
      }
      pvVar8 = (model_outputs_ext->hplanes).
               super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar13 = *(long *)&pvVar8[lVar15].super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>.
                         _M_impl;
      pIVar9 = *(pointer *)
                ((long)&pvVar8[lVar15].super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>.
                        _M_impl + 8);
      plVar16 = (long *)(lVar13 + 200);
      uVar10 = 0;
      for (lVar12 = 0; ((long)pIVar9 - lVar13) / 0xf8 != lVar12; lVar12 = lVar12 + 1) {
        if (*plVar16 == 0) {
          local_38._M_impl.super__Vector_impl_data._M_start[lVar12] = uVar10;
          uVar10 = uVar10 + 1;
        }
        plVar16 = plVar16 + 0x1f;
      }
      sVar5 = prediction_data->nrows;
      lVar13 = sVar5 * lVar14;
      for (sVar17 = 0; sVar5 != sVar17; sVar17 = sVar17 + 1) {
        *(unsigned_long *)((long)tree_num + sVar17 * 8 + lVar13) =
             local_38._M_impl.super__Vector_impl_data._M_start
             [*(long *)((long)tree_num + sVar17 * 8 + lVar13)];
      }
      lVar14 = lVar14 + 8;
    }
  }
  else {
    pvVar1 = (model_outputs->trees).
             super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pvVar2 = (model_outputs->trees).
             super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_38._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_38._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uVar10 = std::
             accumulate<__gnu_cxx::__normal_iterator<std::vector<IsoTree,std::allocator<IsoTree>>*,std::vector<std::vector<IsoTree,std::allocator<IsoTree>>,std::allocator<std::vector<IsoTree,std::allocator<IsoTree>>>>>,unsigned_long,remap_terminal_trees<PredictionData<float,unsigned_long>,unsigned_long>(IsoForest*,ExtIsoForest*,PredictionData<float,unsigned_long>&,unsigned_long*,int)::_lambda(unsigned_long,std::vector<IsoTree,std::allocator<IsoTree>>const&)_1_>
                       (pvVar1,pvVar2,0);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_38,uVar10);
    lVar14 = 0;
    for (lVar15 = 0; puVar11 = local_38._M_impl.super__Vector_impl_data._M_start,
        lVar15 != ((long)pvVar2 - (long)pvVar1) / 0x18; lVar15 = lVar15 + 1) {
      for (; puVar11 != local_38._M_impl.super__Vector_impl_data._M_finish; puVar11 = puVar11 + 1) {
        *puVar11 = 0;
      }
      pvVar3 = (model_outputs->trees).
               super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar13 = *(long *)&pvVar3[lVar15].super__Vector_base<IsoTree,_std::allocator<IsoTree>_>.
                         _M_impl;
      pIVar4 = *(pointer *)
                ((long)&pvVar3[lVar15].super__Vector_base<IsoTree,_std::allocator<IsoTree>_>._M_impl
                + 8);
      plVar16 = (long *)(lVar13 + 0x38);
      uVar10 = 0;
      for (lVar12 = 0; ((long)pIVar4 - lVar13) / 0x70 != lVar12; lVar12 = lVar12 + 1) {
        if (*plVar16 == 0) {
          local_38._M_impl.super__Vector_impl_data._M_start[lVar12] = uVar10;
          uVar10 = uVar10 + 1;
        }
        plVar16 = plVar16 + 0xe;
      }
      sVar5 = prediction_data->nrows;
      lVar13 = sVar5 * lVar14;
      for (sVar17 = 0; sVar5 != sVar17; sVar17 = sVar17 + 1) {
        *(unsigned_long *)((long)tree_num + sVar17 * 8 + lVar13) =
             local_38._M_impl.super__Vector_impl_data._M_start
             [*(long *)((long)tree_num + sVar17 * 8 + lVar13)];
      }
      lVar14 = lVar14 + 8;
    }
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_38);
  return;
}

Assistant:

void remap_terminal_trees(IsoForest *model_outputs, ExtIsoForest *model_outputs_ext,
                          PredictionData &prediction_data, sparse_ix *restrict tree_num, int nthreads)
{
    size_t ntrees = (model_outputs != NULL)? model_outputs->trees.size() : model_outputs_ext->hplanes.size();
    size_t max_tree, curr_term;
    std::vector<sparse_ix> tree_mapping;
    if (model_outputs != NULL)
    {
        max_tree = std::accumulate(model_outputs->trees.begin(),
                                   model_outputs->trees.end(),
                                   (size_t)0,
                                   [](const size_t curr_max, const std::vector<IsoTree> &tr)
                                   {return std::max(curr_max, tr.size());});
        tree_mapping.resize(max_tree);
        for (size_t tree = 0; tree < ntrees; tree++)
        {
            std::fill(tree_mapping.begin(), tree_mapping.end(), (size_t)0);
            curr_term = 0;
            for (size_t node = 0; node < model_outputs->trees[tree].size(); node++)
                if (model_outputs->trees[tree][node].tree_left == 0)
                    tree_mapping[node] = curr_term++;

            #pragma omp parallel for schedule(static) num_threads(nthreads) shared(tree_num, tree_mapping, tree, prediction_data)
            for (size_t_for row = 0; row < (decltype(row))prediction_data.nrows; row++)
                tree_num[row + tree * prediction_data.nrows] = tree_mapping[tree_num[row + tree * prediction_data.nrows]];
        }
    }

    else
    {
        max_tree = std::accumulate(model_outputs_ext->hplanes.begin(),
                                   model_outputs_ext->hplanes.end(),
                                   (size_t)0,
                                   [](const size_t curr_max, const std::vector<IsoHPlane> &tr)
                                   {return std::max(curr_max, tr.size());});
        tree_mapping.resize(max_tree);
        for (size_t tree = 0; tree < ntrees; tree++)
        {
            std::fill(tree_mapping.begin(), tree_mapping.end(), (size_t)0);
            curr_term = 0;
            for (size_t node = 0; node < model_outputs_ext->hplanes[tree].size(); node++)
                if (model_outputs_ext->hplanes[tree][node].hplane_left == 0)
                    tree_mapping[node] = curr_term++;
            
            #pragma omp parallel for schedule(static) num_threads(nthreads) shared(tree_num, tree_mapping, tree, prediction_data)
            for (size_t_for row = 0; row < (decltype(row))prediction_data.nrows; row++)
                tree_num[row + tree * prediction_data.nrows] = tree_mapping[tree_num[row + tree * prediction_data.nrows]];
        }
    }
}